

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<char32_t_*> __thiscall
fmt::v8::detail::format_decimal<char32_t,unsigned__int128>
          (detail *this,char32_t *out,unsigned___int128 value,int size)

{
  undefined2 uVar1;
  detail *pdVar2;
  int iVar3;
  undefined8 in_RAX;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar4;
  undefined8 unaff_RBX;
  detail *pdVar5;
  undefined1 uVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  format_decimal_result<char32_t_*> fVar9;
  
  uVar4 = CONCAT44(in_register_00000014,size);
  auVar6._8_8_ = unaff_RBX;
  auVar6._0_8_ = in_RAX;
  iVar3 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar6);
  if (iVar3 <= in_ECX) {
    pdVar2 = this + (long)in_ECX * 4;
    while (pdVar5 = pdVar2 + -8, (out < (char32_t *)0x64) <= uVar4) {
      auVar8 = __udivti3(out,uVar4,100,0);
      uVar4 = auVar8._8_8_;
      uVar1 = *(undefined2 *)
               (
               "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               + (long)(out + (long)auVar8._0_8_ * -0x19) * 2);
      uVar7 = (undefined1)((ushort)uVar1 >> 8);
      auVar6 = ZEXT416(CONCAT22((short)(CONCAT13(uVar7,CONCAT12(uVar7,uVar1)) >> 0x10),
                                CONCAT11((char)uVar1,(char)uVar1)));
      auVar6 = pshuflw(auVar6,auVar6,0x60);
      *(ulong *)pdVar5 = CONCAT44(auVar6._4_4_ >> 0x18,auVar6._0_4_ >> 0x18);
      out = auVar8._0_8_;
      pdVar2 = pdVar5;
    }
    if (uVar4 == 0 && (ulong)((char32_t *)0x9 < out) <= -uVar4) {
      *(uint *)(pdVar2 + -4) = (uint)out | 0x30;
      pdVar5 = pdVar2 + -4;
    }
    else {
      uVar1 = *(undefined2 *)
               (
               "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               + (long)out * 2);
      uVar7 = (undefined1)((ushort)uVar1 >> 8);
      auVar6 = ZEXT416(CONCAT22((short)(CONCAT13(uVar7,CONCAT12(uVar7,uVar1)) >> 0x10),
                                CONCAT11((char)uVar1,(char)uVar1)));
      auVar6 = pshuflw(auVar6,auVar6,0x60);
      *(ulong *)pdVar5 = CONCAT44(auVar6._4_4_ >> 0x18,auVar6._0_4_ >> 0x18);
    }
    fVar9.end = (char32_t *)(this + (long)in_ECX * 4);
    fVar9.begin = (char32_t *)pdVar5;
    return fVar9;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x45e,"invalid digit count");
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}